

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_4dRect::IntersectRect(ON_4dRect *this,ON_4dRect *r1,ON_4dRect *r2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = ON_Max(r1->left,r2->left);
  this->left = dVar3;
  dVar3 = ON_Min(r1->right,r2->right);
  this->right = dVar3;
  if (this->left <= dVar3 && dVar3 != this->left) {
    dVar3 = ON_Max(r1->top,r2->top);
    this->top = dVar3;
    dVar3 = ON_Min(r1->bottom,r2->bottom);
    this->bottom = dVar3;
    if (this->top <= dVar3 && dVar3 != this->top) {
      return true;
    }
  }
  dVar2 = Zero.bottom;
  dVar1 = Zero.top;
  dVar3 = Zero.left;
  this->right = Zero.right;
  this->bottom = dVar2;
  this->left = dVar3;
  this->top = dVar1;
  return false;
}

Assistant:

bool ON_4dRect::IntersectRect(const ON_4dRect * r1, const ON_4dRect * r2)
{
  // The previous implementation was incorrect. The implementation for ON_4iRect::Intersect
  // was/is correct, so its implemenation is now used here.
  left = ON_Max(r1->left, r2->left);
  right = ON_Min(r1->right, r2->right);
  if (right > left)
  {
    top = ON_Max(r1->top, r2->top);
    bottom = ON_Min(r1->bottom, r2->bottom);
    if (bottom > top)
      return true;
  }

  // degenerate rectangle at this point...
  SetRectEmpty();
  return false;
}